

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

uint64_t __thiscall obx::Transaction::getDataSizeCommitted(Transaction *this)

{
  obx_err err;
  OBX_txn *pOVar1;
  uint64_t size;
  uint64_t local_10;
  
  local_10 = 0;
  pOVar1 = cPtr(this);
  err = obx_txn_data_size(pOVar1,&local_10,0);
  internal::checkErrOrThrow(err);
  return local_10;
}

Assistant:

uint64_t Transaction::getDataSizeCommitted() const {
    uint64_t size = 0;
    internal::checkErrOrThrow(obx_txn_data_size(cPtr(), &size, nullptr));
    return size;
}